

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::DefineGroupFixedInst::Exec
          (DefineGroupFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  ResetGroupCont *this_00;
  GroupInfo *this_01;
  undefined4 *puVar3;
  GroupInfo *groupInfo;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  DefineGroupFixedInst *this_local;
  
  if (((this->super_NoNeedToSaveMixin).noNeedToSave & 1U) == 0) {
    this_00 = (ResetGroupCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::ResetGroupCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    ResetGroupCont::ResetGroupCont(this_00,(this->super_GroupMixin).groupId);
    Matcher::PushStats(matcher,contStack,input);
  }
  this_01 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  bVar2 = GroupInfo::IsUndefined(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xb20,"(groupInfo->IsUndefined())","groupInfo->IsUndefined()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_01->offset = *inputOffset - (this->super_FixedLengthMixin).length;
  this_01->length = (this->super_FixedLengthMixin).length;
  *instPointer = *instPointer + 10;
  return false;
}

Assistant:

inline bool DefineGroupFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!noNeedToSave)
        {
            // UNDO ACTION: Restore group on backtrack
            PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
        Assert(groupInfo->IsUndefined());
        groupInfo->offset = inputOffset - length;
        groupInfo->length = length;

        instPointer += sizeof(*this);
        return false;
    }